

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_open_debugfile_by_debuglink
              (backtrace_state *state,char *filename,char *debuglink_name,uint32_t debuglink_crc,
              backtrace_error_callback error_callback,void *data)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *__dest;
  size_t sVar8;
  char *pcVar9;
  int *piVar10;
  uint uVar11;
  uint32_t uVar12;
  char *size;
  size_t len;
  char *p;
  char *pcVar13;
  byte *pbVar14;
  undefined1 local_118 [8];
  stat st;
  char *local_60;
  
  size = (char *)0x0;
  p = (char *)0x0;
  do {
    iVar2 = lstat(filename,(stat *)local_118);
    if ((iVar2 < 0) || (((uint)st.st_nlink & 0xf000) != 0xa000)) goto LAB_00128d81;
    pcVar13 = (char *)0x80;
    pcVar9 = size;
    do {
      pcVar5 = (char *)tcmalloc_backtrace_alloc(state,(size_t)pcVar13,error_callback,data);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
LAB_00128bef:
        bVar1 = false;
        pcVar9 = pcVar5;
      }
      else {
        pcVar6 = (char *)readlink(filename,pcVar5,(size_t)pcVar13);
        if ((long)pcVar6 < 0) {
          tcmalloc_backtrace_free(state,pcVar5,(size_t)pcVar13,error_callback,data);
          pcVar9 = (char *)0x0;
          bVar1 = false;
        }
        else {
          if (pcVar6 < pcVar13 + -1) {
            pcVar5[(long)pcVar6] = '\0';
            local_60 = pcVar13;
            goto LAB_00128bef;
          }
          tcmalloc_backtrace_free(state,pcVar5,(size_t)pcVar13,error_callback,data);
          pcVar13 = (char *)((long)pcVar13 * 2);
          bVar1 = true;
        }
      }
    } while (bVar1);
    pcVar13 = size;
    pcVar5 = p;
    if (pcVar9 == (char *)0x0) {
      iVar2 = 3;
      pcVar9 = filename;
    }
    else {
      if ((*pcVar9 != '/') && (pcVar6 = strrchr(filename,0x2f), pcVar6 != (char *)0x0)) {
        sVar7 = strlen(pcVar9);
        __dest = (char *)tcmalloc_backtrace_alloc
                                   (state,(size_t)(pcVar6 + (sVar7 - (long)filename) + 2),
                                    error_callback,data);
        if (__dest == (char *)0x0) {
          iVar2 = 4;
          pcVar9 = filename;
          goto LAB_00128d58;
        }
        pcVar13 = pcVar6 + (1 - (long)filename);
        memcpy(__dest,filename,(size_t)pcVar13);
        sVar8 = strlen(pcVar9);
        memcpy(__dest + (long)pcVar13,pcVar9,sVar8);
        sVar8 = strlen(pcVar9);
        (__dest + (long)pcVar13)[sVar8] = '\0';
        tcmalloc_backtrace_free(state,pcVar9,(size_t)local_60,error_callback,data);
        pcVar9 = __dest;
        local_60 = pcVar6 + (sVar7 - (long)filename) + 2;
      }
      iVar2 = 0;
      pcVar13 = local_60;
      pcVar5 = pcVar9;
      if (p != (char *)0x0) {
        tcmalloc_backtrace_free(state,p,(size_t)size,error_callback,data);
      }
    }
LAB_00128d58:
    size = pcVar13;
    filename = pcVar9;
    p = pcVar5;
  } while (iVar2 == 0);
  if (iVar2 == 4) {
    iVar2 = -1;
  }
  else {
    if (iVar2 != 3) goto LAB_00128e44;
LAB_00128d81:
    pcVar9 = strrchr(filename,0x2f);
    pcVar13 = pcVar9 + (1 - (long)filename);
    if (pcVar9 == (char *)0x0) {
      filename = "";
      pcVar13 = (char *)0x0;
    }
    iVar2 = elf_try_debugfile(state,filename,(size_t)pcVar13,"",0,debuglink_name,error_callback,data
                             );
    if ((iVar2 < 0) &&
       (iVar2 = elf_try_debugfile(state,filename,(size_t)pcVar13,".debug/",7,debuglink_name,
                                  error_callback,data), iVar2 < 0)) {
      iVar4 = elf_try_debugfile(state,"/usr/lib/debug/",0xf,filename,(size_t)pcVar13,debuglink_name,
                                error_callback,data);
      iVar2 = -1;
      if (-1 < iVar4) {
        iVar2 = iVar4;
      }
    }
  }
  if ((p != (char *)0x0) && (size != (char *)0x0)) {
    tcmalloc_backtrace_free(state,p,(size_t)size,error_callback,data);
  }
LAB_00128e44:
  iVar4 = -1;
  if ((-1 < iVar2) && (iVar4 = iVar2, debuglink_crc != 0)) {
    iVar3 = fstat(iVar2,(stat *)local_118);
    if (iVar3 < 0) {
      piVar10 = __errno_location();
      (*error_callback)(data,"fstat",*piVar10);
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      iVar3 = tcmalloc_backtrace_get_view
                        (state,iVar2,0,st.st_rdev,error_callback,data,
                         (backtrace_view *)(st.__glibc_reserved + 2));
      if (iVar3 != 0) {
        if ((long)st.st_rdev < 1) {
          uVar12 = 0;
        }
        else {
          pbVar14 = (byte *)(st.st_rdev + st.__glibc_reserved[2]);
          uVar11 = 0xffffffff;
          do {
            uVar11 = uVar11 >> 8 ^
                     *(uint *)(elf_crc32_crc32_table +
                              (ulong)(byte)(*(byte *)st.__glibc_reserved[2] ^ (byte)uVar11) * 4);
            st.__glibc_reserved[2] = st.__glibc_reserved[2] + 1;
          } while ((ulong)st.__glibc_reserved[2] < pbVar14);
          uVar12 = ~uVar11;
        }
        tcmalloc_backtrace_release_view
                  (state,(backtrace_view *)(st.__glibc_reserved + 2),error_callback,data);
      }
    }
    if (uVar12 != debuglink_crc) {
      tcmalloc_backtrace_close(iVar2,error_callback,data);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

static int
elf_open_debugfile_by_debuglink (struct backtrace_state *state,
				 const char *filename,
				 const char *debuglink_name,
				 uint32_t debuglink_crc,
				 backtrace_error_callback error_callback,
				 void *data)
{
  int ddescriptor;

  ddescriptor = elf_find_debugfile_by_debuglink (state, filename,
						 debuglink_name,
						 error_callback, data);
  if (ddescriptor < 0)
    return -1;

  if (debuglink_crc != 0)
    {
      uint32_t got_crc;

      got_crc = elf_crc32_file (state, ddescriptor, error_callback, data);
      if (got_crc != debuglink_crc)
	{
	  backtrace_close (ddescriptor, error_callback, data);
	  return -1;
	}
    }

  return ddescriptor;
}